

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COBLoader.cpp
# Opt level: O1

void __thiscall
Assimp::COBImporter::ReadFloat3Tuple_Ascii<aiColor3D>(COBImporter *this,aiColor3D *fill,char **in)

{
  Assimp AVar1;
  ulong in_RAX;
  Assimp *this_00;
  aiColor3D *paVar2;
  int iVar3;
  undefined8 uStack_38;
  
  this_00 = (Assimp *)*in;
  iVar3 = 0;
  uStack_38 = in_RAX;
  do {
    for (; (AVar1 = *this_00, AVar1 == (Assimp)0x9 || (AVar1 == (Assimp)0x20));
        this_00 = this_00 + 1) {
    }
    if (AVar1 != (Assimp)0x2c) goto LAB_004b4a83;
    do {
      this_00 = this_00 + 1;
LAB_004b4a83:
      AVar1 = *this_00;
    } while ((AVar1 == (Assimp)0x20) || (AVar1 == (Assimp)0x9));
    uStack_38 = uStack_38 & 0xffffffff;
    this_00 = (Assimp *)
              fast_atoreal_move<float>
                        (this_00,(char *)((long)&uStack_38 + 4),(float *)0x1,(bool)AVar1);
    paVar2 = (aiColor3D *)&fill->b;
    if ((iVar3 != 2) && (paVar2 = fill, iVar3 == 1)) {
      paVar2 = (aiColor3D *)&fill->g;
    }
    paVar2->r = uStack_38._4_4_;
    iVar3 = iVar3 + 1;
  } while (iVar3 != 3);
  *in = (char *)this_00;
  return;
}

Assistant:

void COBImporter::ReadFloat3Tuple_Ascii(T& fill, const char** in)
{
    const char* rgb = *in;
    for(unsigned int i = 0; i < 3; ++i) {
        SkipSpaces(&rgb);
        if (*rgb == ',')++rgb;
        SkipSpaces(&rgb);

        fill[i] = fast_atof(&rgb);
    }
    *in = rgb;
}